

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformation_gizmo.cpp
# Opt level: O3

void __thiscall polyscope::TransformationGizmo::prepare(TransformationGizmo *this)

{
  pointer pvVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  pointer pcVar4;
  Engine *pEVar5;
  Engine *pEVar6;
  pointer pbVar7;
  pointer pbVar8;
  _Alloc_hider _Var9;
  size_type sVar10;
  TransformationGizmo *this_00;
  long lVar11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<glm::vec<3,_float,_(glm::qualifier)0>_> __l_01;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  coords;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  normals;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  colors;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  texcoords;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  center;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  components;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  undefined1 local_2c8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b0;
  undefined1 *local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  TransformationGizmo *local_278;
  undefined1 local_270 [32];
  pointer local_250 [2];
  vec<2,_float,_(glm::qualifier)0> local_240;
  vec<3,_float,_(glm::qualifier)0> *local_230 [2];
  vec<3,_float,_(glm::qualifier)0> local_220;
  pointer local_210;
  undefined1 local_1f8 [24];
  string local_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8;
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  string local_170;
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pEVar5 = render::engine;
  pvVar1 = (pointer)(local_270 + 0x10);
  local_270._0_8_ = pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"TRANSFORMATION_GIZMO_ROT","")
  ;
  local_2c8._0_8_ = (pointer)0x0;
  local_2c8._8_8_ = (pointer)0x0;
  local_2c8._16_8_ = (pointer)0x0;
  (*pEVar5->_vptr_Engine[0x2b])(&local_328,pEVar5,local_270,local_2c8,3);
  pbVar8 = local_328.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar7 = local_328.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var2 = (this->ringProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->ringProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pbVar7;
  (this->ringProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbVar8;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if (local_328.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_328.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_2c8);
  if ((pointer)local_270._0_8_ != pvVar1) {
    operator_delete((void *)local_270._0_8_);
  }
  local_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_308.field_2._M_allocated_capacity = 0;
  local_2e8.field_2._M_allocated_capacity = 0;
  local_298.field_2._M_allocated_capacity = 0;
  local_1f8._16_8_ = 0;
  local_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_308._M_dataplus._M_p = (pointer)0x0;
  local_308._M_string_length = 0;
  local_2e8._M_dataplus._M_p = (pointer)0x0;
  local_2e8._M_string_length = 0;
  local_298._M_dataplus._M_p = (pointer)0x0;
  local_298._M_string_length = 0;
  local_1f8._0_8_ = (pointer)0x0;
  local_1f8._8_8_ = 0;
  triplePlaneCoords((tuple<std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                     *)local_270,this);
  local_2c8._0_8_ = local_1f8;
  local_2c8._8_8_ = &local_298;
  local_2c8._16_8_ = &local_2e8;
  local_2b0 = &local_308;
  local_2a8 = (undefined1 *)&local_328;
  std::
  _Tuple_impl<0ul,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&,std::vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>&,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&>
  ::
  _M_assign<std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>,std::vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>>
            ((_Tuple_impl<0ul,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&,std::vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>&,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&>
              *)local_2c8,
             (_Tuple_impl<0UL,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
              *)local_270);
  if (local_210 != (pointer)0x0) {
    operator_delete(local_210);
  }
  if (local_230[1] != (pointer)0x0) {
    operator_delete(local_230[1]);
  }
  if (local_240 != (vec<2,_float,_(glm::qualifier)0>)0x0) {
    operator_delete((void *)local_240);
  }
  if ((pointer)local_270._24_8_ != (pointer)0x0) {
    operator_delete((void *)local_270._24_8_);
  }
  if ((pointer)local_270._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_270._0_8_);
  }
  peVar3 = (this->ringProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"a_position","");
  (*peVar3->_vptr_ShaderProgram[0x15])(peVar3,local_50,&local_328);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  peVar3 = (this->ringProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"a_normal","");
  (*peVar3->_vptr_ShaderProgram[0x15])(peVar3,local_70,&local_308);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  peVar3 = (this->ringProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"a_color","");
  (*peVar3->_vptr_ShaderProgram[0x15])(peVar3,local_90,&local_2e8);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  peVar3 = (this->ringProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"a_texcoord","");
  (*peVar3->_vptr_ShaderProgram[0x14])(peVar3,local_b0,&local_298);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  peVar3 = (this->ringProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"a_component","");
  (*peVar3->_vptr_ShaderProgram[0x15])(peVar3,local_d0,local_1f8);
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  if ((pointer)local_1f8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1f8._0_8_);
  }
  if (local_298._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  if (local_2e8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_2e8._M_dataplus._M_p);
  }
  if ((element_type *)local_308._M_dataplus._M_p != (element_type *)0x0) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  local_278 = this;
  if (local_328.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_328.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  pEVar5 = render::engine;
  local_2c8._0_8_ = local_2c8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"RAYCAST_VECTOR","");
  pEVar6 = render::engine;
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  pcVar4 = (local_278->material)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_1f8 + 0x18),pcVar4,pcVar4 + (local_278->material)._M_string_length);
  local_270._0_8_ = pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"VECTOR_PROPAGATE_COLOR","");
  local_250[0] = (pointer)&local_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"TRANSFORMATION_GIZMO_VEC","")
  ;
  local_230[0] = &local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"SHADE_COLOR","");
  __l._M_len = 3;
  __l._M_array = (iterator)local_270;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1a8,__l,(allocator_type *)&local_2e8);
  render::Engine::addMaterialRules(&local_328,pEVar6,(string *)(local_1f8 + 0x18),&local_1a8);
  (*pEVar5->_vptr_Engine[0x2b])(&local_308,pEVar5,local_2c8,&local_328,3);
  this_00 = local_278;
  sVar10 = local_308._M_string_length;
  _Var9._M_p = local_308._M_dataplus._M_p;
  local_308._M_dataplus._M_p = (pointer)0x0;
  local_308._M_string_length = 0;
  p_Var2 = (local_278->arrowProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (local_278->arrowProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var9._M_p;
  (local_278->arrowProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar10;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._M_string_length);
    }
  }
  local_298.field_2._8_8_ = &this_00->material;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_328);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1a8);
  lVar11 = 0;
  do {
    if ((void *)((long)&local_220.field_0 + lVar11) != *(void **)((long)local_230 + lVar11)) {
      operator_delete(*(void **)((long)local_230 + lVar11));
    }
    lVar11 = lVar11 + -0x20;
  } while (lVar11 != -0x60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  if ((pointer)local_2c8._0_8_ != (pointer)(local_2c8 + 0x10)) {
    operator_delete((void *)local_2c8._0_8_);
  }
  local_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_308.field_2._M_allocated_capacity = 0;
  local_2e8.field_2._M_allocated_capacity = 0;
  local_298.field_2._M_allocated_capacity = 0;
  local_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_308._M_dataplus._M_p = (pointer)0x0;
  local_308._M_string_length = 0;
  local_2e8._M_dataplus._M_p = (pointer)0x0;
  local_2e8._M_string_length = 0;
  local_298._M_dataplus._M_p = (pointer)0x0;
  local_298._M_string_length = 0;
  tripleArrowCoords((tuple<std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                     *)local_270,this_00);
  local_2c8._0_8_ = &local_298;
  local_2c8._8_8_ = &local_2e8;
  local_2c8._16_8_ = &local_308;
  local_2b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_328;
  std::
  _Tuple_impl<0ul,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&>
  ::
  _M_assign<std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>>
            ((_Tuple_impl<0ul,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>&>
              *)local_2c8,
             (_Tuple_impl<0UL,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
              *)local_270);
  if (local_230[1] != (pointer)0x0) {
    operator_delete(local_230[1]);
  }
  if (local_240 != (vec<2,_float,_(glm::qualifier)0>)0x0) {
    operator_delete((void *)local_240);
  }
  if ((pointer)local_270._24_8_ != (pointer)0x0) {
    operator_delete((void *)local_270._24_8_);
  }
  if ((pointer)local_270._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_270._0_8_);
  }
  peVar3 = (this_00->arrowProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"a_vector","");
  (*peVar3->_vptr_ShaderProgram[0x15])(peVar3,local_f0,&local_328);
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0]);
  }
  peVar3 = (this_00->arrowProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"a_position","");
  (*peVar3->_vptr_ShaderProgram[0x15])(peVar3,local_110,&local_308);
  if (local_110[0] != local_100) {
    operator_delete(local_110[0]);
  }
  peVar3 = (this_00->arrowProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"a_color","");
  (*peVar3->_vptr_ShaderProgram[0x15])(peVar3,local_130,&local_2e8);
  if (local_130[0] != local_120) {
    operator_delete(local_130[0]);
  }
  peVar3 = (this_00->arrowProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_150[0] = local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"a_component","");
  (*peVar3->_vptr_ShaderProgram[0x15])(peVar3,local_150,&local_298);
  if (local_150[0] != local_140) {
    operator_delete(local_150[0]);
  }
  render::Engine::setMaterial
            (render::engine,
             (this_00->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,(string *)local_298.field_2._8_8_);
  if (local_298._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  if (local_2e8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_2e8._M_dataplus._M_p);
  }
  if ((element_type *)local_308._M_dataplus._M_p != (element_type *)0x0) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  if (local_328.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_328.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  pEVar5 = render::engine;
  local_2c8._0_8_ = local_2c8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"RAYCAST_SPHERE","");
  pEVar6 = render::engine;
  pcVar4 = (this_00->material)._M_dataplus._M_p;
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,pcVar4,pcVar4 + (this_00->material)._M_string_length);
  local_270._0_8_ = local_270 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"SHADE_BASECOLOR","");
  local_250[0] = (pointer)&local_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"LIGHT_MATCAP","");
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_270;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1c0,__l_00,(allocator_type *)&local_2e8);
  render::Engine::addMaterialRules(&local_328,pEVar6,&local_170,&local_1c0);
  (*pEVar5->_vptr_Engine[0x2b])(&local_308,pEVar5,local_2c8,&local_328,3);
  sVar10 = local_308._M_string_length;
  _Var9._M_p = local_308._M_dataplus._M_p;
  local_308._M_dataplus._M_p = (pointer)0x0;
  local_308._M_string_length = 0;
  p_Var2 = (this_00->sphereProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this_00->sphereProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var9._M_p;
  (this_00->sphereProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar10;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._M_string_length);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_328);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c0);
  lVar11 = 0;
  do {
    if ((void *)((long)&local_240.field_0 + lVar11) != *(void **)((long)local_250 + lVar11)) {
      operator_delete(*(void **)((long)local_250 + lVar11));
    }
    lVar11 = lVar11 + -0x20;
  } while (lVar11 != -0x40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((pointer)local_2c8._0_8_ != (pointer)(local_2c8 + 0x10)) {
    operator_delete((void *)local_2c8._0_8_);
  }
  render::Engine::setMaterial
            (render::engine,
             (this_00->sphereProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,(string *)local_298.field_2._8_8_);
  local_2c8._0_8_ = (pointer)0x0;
  local_2c8._8_8_ = local_2c8._8_8_ & 0xffffffff00000000;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_2c8;
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)local_270,__l_01,(allocator_type *)&local_328);
  peVar3 = (this_00->sphereProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_190[0] = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"a_position","");
  (*peVar3->_vptr_ShaderProgram[0x15])(peVar3,local_190,local_270);
  if (local_190[0] != local_180) {
    operator_delete(local_190[0]);
  }
  if ((pointer)local_270._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_270._0_8_);
  }
  return;
}

Assistant:

void TransformationGizmo::prepare() {

  { // The rotation rings, drawn via textured quads
    // clang-format off
    ringProgram = render::engine->requestShader("TRANSFORMATION_GIZMO_ROT", 
        {}, 
      render::ShaderReplacementDefaults::Process);
    // clang-format on

    std::vector<glm::vec3> coords;
    std::vector<glm::vec3> normals;
    std::vector<glm::vec3> colors;
    std::vector<glm::vec2> texcoords;
    std::vector<glm::vec3> components;
    std::tie(coords, normals, colors, texcoords, components) = triplePlaneCoords();

    ringProgram->setAttribute("a_position", coords);
    ringProgram->setAttribute("a_normal", normals);
    ringProgram->setAttribute("a_color", colors);
    ringProgram->setAttribute("a_texcoord", texcoords);
    ringProgram->setAttribute("a_component", components);
  }

  { // Translation arrows
    // clang-format off
    arrowProgram = render::engine->requestShader("RAYCAST_VECTOR",       
      render::engine->addMaterialRules(material,
        {
          "VECTOR_PROPAGATE_COLOR", 
          "TRANSFORMATION_GIZMO_VEC", 
          "SHADE_COLOR", 
        }
      ),
      render::ShaderReplacementDefaults::Process);
    // clang-format on

    std::vector<glm::vec3> vectors;
    std::vector<glm::vec3> bases;
    std::vector<glm::vec3> colors;
    std::vector<glm::vec3> components;
    std::tie(vectors, bases, colors, components) = tripleArrowCoords();

    arrowProgram->setAttribute("a_vector", vectors);
    arrowProgram->setAttribute("a_position", bases);
    arrowProgram->setAttribute("a_color", colors);
    arrowProgram->setAttribute("a_component", components);

    render::engine->setMaterial(*arrowProgram, material);
  }

  { // Scale sphere
    // clang-format off
    sphereProgram = render::engine->requestShader("RAYCAST_SPHERE", 
        render::engine->addMaterialRules(material,
          {
            "SHADE_BASECOLOR", 
            "LIGHT_MATCAP"
          }
        ),
      render::ShaderReplacementDefaults::Process);
    // clang-format on

    render::engine->setMaterial(*sphereProgram, material);

    std::vector<glm::vec3> center = {glm::vec3(0., 0., 0.)};
    sphereProgram->setAttribute("a_position", center);
  }
}